

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene_points.h
# Opt level: O1

PrimInfoMB * __thiscall
embree::avx512::PointsISA::createPrimRefMBArray
          (PrimInfoMB *__return_storage_ptr__,PointsISA *this,mvector<PrimRefMB> *prims,BBox1f *t0t1
          ,range<unsigned_long> *r,size_t k,uint geomID)

{
  RawBufferView *pRVar1;
  uint *puVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  undefined4 uVar7;
  undefined8 uVar8;
  BBox1f BVar9;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar10;
  byte bVar11;
  BufferView<embree::Vec3fx> *pBVar12;
  char *pcVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  undefined8 uVar17;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar18;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar19;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar20;
  BBox1f *pBVar21;
  uint uVar22;
  int iVar23;
  PrimRefMB *pPVar24;
  long lVar25;
  ulong uVar26;
  uint uVar27;
  ulong unaff_RBP;
  long lVar28;
  size_t sVar29;
  size_t sVar30;
  long lVar31;
  ulong uVar32;
  ulong uVar33;
  size_t *psVar34;
  int iVar35;
  ulong uVar36;
  int iVar37;
  bool bVar38;
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar57;
  undefined1 auVar59 [64];
  undefined1 auVar60 [64];
  undefined1 auVar61 [16];
  undefined1 auVar62 [64];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar63;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar65;
  undefined1 auVar66 [64];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar67;
  undefined1 auVar68 [64];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar69;
  undefined1 auVar70 [64];
  undefined1 auVar71 [16];
  undefined1 auVar72 [64];
  undefined1 auVar73 [64];
  undefined1 auVar74 [64];
  undefined1 auVar75 [64];
  undefined1 auVar76 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar77;
  undefined1 auVar78 [64];
  unsigned_long local_48;
  undefined1 auVar58 [64];
  undefined1 auVar64 [64];
  
  aVar57.m128[2] = INFINITY;
  aVar57._0_8_ = 0x7f8000007f800000;
  aVar57.m128[3] = INFINITY;
  auVar58 = ZEXT1664((undefined1  [16])aVar57);
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds0.lower.
  field_0 = aVar57;
  aVar63.m128[2] = -INFINITY;
  aVar63._0_8_ = 0xff800000ff800000;
  aVar63.m128[3] = -INFINITY;
  auVar64 = ZEXT1664((undefined1  [16])aVar63);
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds0.upper.
  field_0 = aVar63;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds1.lower.
  field_0 = aVar57;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds1.upper.
  field_0 = aVar63;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).centBounds.lower.field_0
       = aVar57;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).centBounds.upper.field_0
       = aVar63;
  (__return_storage_ptr__->object_range)._begin = 0;
  (__return_storage_ptr__->object_range)._end = 0;
  __return_storage_ptr__->num_time_segments = 0;
  __return_storage_ptr__->max_num_time_segments = 0;
  pPVar24 = (PrimRefMB *)0x0;
  (__return_storage_ptr__->max_time_range).lower = 0.0;
  auVar39._8_4_ = 0x3f800000;
  auVar39._0_8_ = &DAT_3f8000003f800000;
  auVar39._12_4_ = 0x3f800000;
  uVar8 = vmovlps_avx(auVar39);
  *(undefined8 *)&(__return_storage_ptr__->max_time_range).upper = uVar8;
  (__return_storage_ptr__->time_range).upper = 0.0;
  uVar32 = r->_begin;
  auVar40._8_8_ = 0;
  auVar40._0_4_ = (__return_storage_ptr__->time_range).lower;
  auVar40._4_4_ = (__return_storage_ptr__->time_range).upper;
  auVar62 = ZEXT1664(auVar40);
  sVar29 = __return_storage_ptr__->num_time_segments;
  uVar26 = __return_storage_ptr__->max_num_time_segments;
  auVar60 = ZEXT464((uint)(__return_storage_ptr__->max_time_range).lower);
  auVar59 = ZEXT464((uint)(__return_storage_ptr__->max_time_range).upper);
  aVar69 = aVar57;
  aVar67 = aVar63;
  aVar65 = aVar57;
  aVar77 = aVar63;
  if (uVar32 < r->_end) {
    auVar72 = ZEXT464(0x3f7ffffc);
    local_48 = (__return_storage_ptr__->object_range)._end;
    auVar73 = ZEXT1664(ZEXT816(0) << 0x40);
    auVar76._8_4_ = 0x3f000000;
    auVar76._0_8_ = 0x3f0000003f000000;
    auVar76._12_4_ = 0x3f000000;
    auVar39 = vbroadcastss_avx512vl(ZEXT416(0x5dccb9a2));
    auVar70 = ZEXT1664((undefined1  [16])aVar57);
    auVar68 = ZEXT1664((undefined1  [16])aVar63);
    auVar66 = ZEXT1664((undefined1  [16])aVar57);
    auVar78 = ZEXT1664((undefined1  [16])aVar63);
    pBVar21 = t0t1;
    auVar74 = ZEXT464(0x3f800000);
    do {
      auVar42._8_8_ = 0;
      auVar42._0_4_ = (this->super_Points).super_Geometry.time_range.lower;
      auVar42._4_4_ = (this->super_Points).super_Geometry.time_range.upper;
      fVar3 = pBVar21->upper;
      auVar40 = vmovshdup_avx512vl(auVar42);
      auVar40 = vsubss_avx512f(auVar40,auVar42);
      auVar41 = vsubss_avx512f(ZEXT416((uint)fVar3),auVar42);
      auVar41 = vdivss_avx512f(auVar41,auVar40);
      auVar53 = auVar72._0_16_;
      auVar41 = vmulss_avx512f(auVar41,auVar53);
      uVar36 = uVar32 & 0xffffffff;
      pBVar12 = (this->super_Points).vertices.items;
      sVar30 = k;
      auVar75 = auVar74;
      if (uVar36 < (pBVar12->super_RawBufferView).num) {
        fVar4 = (this->super_Points).super_Geometry.fnumTimeSegments;
        fVar5 = pBVar21->lower;
        auVar41 = vmulss_avx512f(ZEXT416((uint)fVar4),auVar41);
        auVar41 = vrndscaless_avx512f(auVar41,auVar41);
        bVar11 = *(byte *)((long)&pPVar24[-2].time_range.lower + 1);
        *(char *)(unaff_RBP - 0xe) = *(char *)(unaff_RBP - 0xe) + (char)uVar32;
        uVar27 = vcvttss2si_avx512f(auVar41);
        unaff_RBP = CONCAT44((int)(unaff_RBP >> 0x20),uVar27);
        auVar41 = vsubss_avx512f(ZEXT416((uint)fVar5),auVar42);
        auVar40 = vdivss_avx512f(auVar41,auVar40);
        auVar40 = vmulss_avx512f(ZEXT416((uint)fVar4),ZEXT416((uint)(auVar40._0_4_ * 1.0000002)));
        auVar40 = vroundss_avx(auVar40,auVar40,9);
        auVar41 = auVar73._0_16_;
        auVar40 = vmaxss_avx(auVar41,auVar40);
        uVar22 = (uint)auVar40._0_4_;
        pPVar24 = (PrimRefMB *)CONCAT44((int)((ulong)pPVar24 >> 0x20),uVar22);
        bVar38 = uVar27 < uVar22;
        pBVar21 = (BBox1f *)
                  CONCAT62((int6)((ulong)pBVar21 >> 0x10),
                           CONCAT11((byte)((ulong)pBVar21 >> 8) | bVar11,(char)pBVar21));
        if (uVar22 <= uVar27) {
          uVar33 = (ulong)(int)uVar22;
          pPVar24 = (PrimRefMB *)pBVar12[uVar33].super_RawBufferView.ptr_ofs;
          lVar25 = pBVar12[uVar33].super_RawBufferView.stride * uVar36;
          aVar10 = *(anon_union_16_2_47237d3f_for_Vec3fx_0 *)
                    ((long)&(pPVar24->lbounds).bounds0.lower.field_0 + lVar25);
          auVar43._8_4_ = 0xddccb9a2;
          auVar43._0_8_ = 0xddccb9a2ddccb9a2;
          auVar43._12_4_ = 0xddccb9a2;
          uVar8 = vcmpps_avx512vl((undefined1  [16])aVar10,auVar43,6);
          uVar17 = vcmpps_avx512vl((undefined1  [16])aVar10,auVar39,1);
          pBVar21 = t0t1;
          if (((byte)((byte)uVar8 & (byte)uVar17) == 0xf) &&
             (0.0 <= *(float *)((long)&(pPVar24->lbounds).bounds0.lower.field_0 + lVar25 + 0xc))) {
            unaff_RBP = (ulong)(int)uVar27;
            psVar34 = &pBVar12[uVar33 + 1].super_RawBufferView.stride;
            do {
              uVar33 = uVar33 + 1;
              bVar38 = unaff_RBP < uVar33;
              if (unaff_RBP < uVar33) goto LAB_01fb5753;
              pRVar1 = (RawBufferView *)(psVar34 + -2);
              pPVar24 = (PrimRefMB *)(*psVar34 * uVar36);
              auVar40 = *(undefined1 (*) [16])(pRVar1->ptr_ofs + (long)&(pPVar24->lbounds).bounds0);
              auVar44._8_4_ = 0xddccb9a2;
              auVar44._0_8_ = 0xddccb9a2ddccb9a2;
              auVar44._12_4_ = 0xddccb9a2;
              uVar8 = vcmpps_avx512vl(auVar40,auVar44,6);
              uVar17 = vcmpps_avx512vl(auVar40,auVar39,1);
            } while (((byte)((byte)uVar8 & (byte)uVar17) == 0xf) &&
                    (psVar34 = psVar34 + 7,
                    0.0 <= *(float *)(pRVar1->ptr_ofs + 0xc + (long)&(pPVar24->lbounds).bounds0)));
          }
          if (!bVar38) goto LAB_01fb5be9;
        }
LAB_01fb5753:
        auVar61 = auVar62._0_16_;
        fVar6 = (this->super_Points).super_Geometry.time_range.lower;
        auVar40 = vsubss_avx512f(ZEXT416((uint)fVar5),ZEXT416((uint)fVar6));
        auVar42 = vsubss_avx512f(ZEXT416((uint)(this->super_Points).super_Geometry.time_range.upper)
                                 ,ZEXT416((uint)fVar6));
        auVar43 = vdivss_avx512f(auVar40,auVar42);
        auVar44 = vsubss_avx512f(ZEXT416((uint)fVar3),ZEXT416((uint)fVar6));
        auVar42 = vdivss_avx512f(auVar44,auVar42);
        auVar49 = ZEXT416((uint)fVar4);
        auVar44 = vmulss_avx512f(auVar49,auVar43);
        auVar45 = vmulss_avx512f(auVar49,auVar42);
        auVar46 = vrndscaless_avx512f(auVar44,auVar44);
        puVar2 = (uint *)((long)&pPVar24[-2].lbounds.bounds1.lower.field_0.field_1.x + 3);
        *puVar2 = *puVar2 | (uint)&stack0xffffffffffffffd0;
        pBVar21 = (BBox1f *)(ulong)((int)pBVar21 + 0xf51df600);
        auVar47 = vmaxss_avx512f(auVar46,auVar41);
        auVar48 = vminss_avx512f(auVar40,auVar49);
        iVar23 = vcvttss2si_avx512f(auVar47);
        iVar35 = vcvttss2si_avx512f(auVar46);
        uVar22 = vcvttss2si_avx512f(auVar40);
        if (iVar35 < 0) {
          iVar35 = -1;
        }
        iVar37 = vcvttss2si_avx512f(auVar49);
        uVar27 = iVar37 + 1U;
        if ((int)uVar22 < (int)(iVar37 + 1U)) {
          uVar27 = uVar22;
        }
        lVar25 = (long)iVar23;
        pBVar12 = (this->super_Points).vertices.items;
        pcVar13 = pBVar12[lVar25].super_RawBufferView.ptr_ofs;
        lVar31 = pBVar12[lVar25].super_RawBufferView.stride * uVar32;
        auVar40 = *(undefined1 (*) [16])(pcVar13 + lVar31);
        auVar46 = vbroadcastss_avx512vl(ZEXT416((uint)(this->super_Points).maxRadiusScale));
        auVar49 = vmulss_avx512f(auVar46,ZEXT416(*(uint *)(pcVar13 + lVar31 + 0xc)));
        auVar49 = vbroadcastss_avx512vl(auVar49);
        auVar50 = vsubps_avx512vl(auVar40,auVar49);
        auVar49 = vaddps_avx512vl(auVar40,auVar49);
        lVar31 = (long)(int)auVar48._0_4_;
        unaff_RBP = lVar31 * 0x38;
        pcVar13 = pBVar12[lVar31].super_RawBufferView.ptr_ofs;
        lVar28 = pBVar12[lVar31].super_RawBufferView.stride * uVar32;
        auVar40 = *(undefined1 (*) [16])(pcVar13 + lVar28);
        auVar51 = vmulss_avx512f(auVar46,ZEXT416(*(uint *)(pcVar13 + lVar28 + 0xc)));
        auVar51 = vbroadcastss_avx512vl(auVar51);
        auVar52 = vsubps_avx512vl(auVar40,auVar51);
        auVar40 = vaddps_avx512vl(auVar40,auVar51);
        auVar44 = vsubss_avx512f(auVar44,auVar47);
        auVar47 = auVar74._0_16_;
        if (uVar27 - iVar35 == 1) {
          auVar42 = vmaxss_avx(auVar44,auVar41);
          auVar53 = vsubss_avx512f(auVar47,auVar42);
          auVar46._0_4_ = auVar42._0_4_;
          auVar46._4_4_ = auVar46._0_4_;
          auVar46._8_4_ = auVar46._0_4_;
          auVar46._12_4_ = auVar46._0_4_;
          auVar42 = vmulps_avx512vl(auVar46,auVar52);
          auVar53 = vbroadcastss_avx512vl(auVar53);
          auVar54 = vfmadd231ps_avx512vl(auVar42,auVar53,auVar50);
          auVar42 = vmulps_avx512vl(auVar46,auVar40);
          auVar55 = vfmadd231ps_avx512vl(auVar42,auVar49,auVar53);
          auVar42 = vsubss_avx512f(auVar48,auVar45);
          auVar41 = vmaxss_avx512f(auVar42,auVar41);
          auVar42 = vsubss_avx512f(auVar47,auVar41);
          auVar41 = vbroadcastss_avx512vl(auVar41);
          auVar53 = vmulps_avx512vl(auVar50,auVar41);
          auVar42 = vbroadcastss_avx512vl(auVar42);
          auVar45 = vfmadd213ps_avx512vl(auVar52,auVar42,auVar53);
          auVar41 = vmulps_avx512vl(auVar49,auVar41);
          auVar40 = vfmadd213ps_avx512vl(auVar40,auVar42,auVar41);
        }
        else {
          pcVar13 = pBVar12[lVar25 + 1].super_RawBufferView.ptr_ofs;
          lVar25 = pBVar12[lVar25 + 1].super_RawBufferView.stride * uVar32;
          auVar41 = *(undefined1 (*) [16])(pcVar13 + lVar25);
          uVar7 = *(undefined4 *)(pcVar13 + lVar25 + 0xc);
          auVar51._4_4_ = uVar7;
          auVar51._0_4_ = uVar7;
          auVar51._8_4_ = uVar7;
          auVar51._12_4_ = uVar7;
          auVar55 = vmulps_avx512vl(auVar46,auVar51);
          auVar54 = vsubps_avx512vl(auVar41,auVar55);
          pcVar13 = pBVar12[lVar31 + -1].super_RawBufferView.ptr_ofs;
          lVar25 = pBVar12[lVar31 + -1].super_RawBufferView.stride * uVar32;
          auVar51 = *(undefined1 (*) [16])(pcVar13 + lVar25);
          auVar55 = vaddps_avx512vl(auVar41,auVar55);
          uVar7 = *(undefined4 *)(pcVar13 + lVar25 + 0xc);
          auVar41._4_4_ = uVar7;
          auVar41._0_4_ = uVar7;
          auVar41._8_4_ = uVar7;
          auVar41._12_4_ = uVar7;
          auVar41 = vmulps_avx512vl(auVar46,auVar41);
          auVar56 = vsubps_avx512vl(auVar51,auVar41);
          auVar51 = vaddps_avx512vl(auVar51,auVar41);
          auVar41 = vmaxss_avx(auVar44,ZEXT816(0) << 0x40);
          auVar44 = vsubss_avx512f(auVar47,auVar41);
          auVar71._0_4_ = auVar41._0_4_;
          auVar71._4_4_ = auVar71._0_4_;
          auVar71._8_4_ = auVar71._0_4_;
          auVar71._12_4_ = auVar71._0_4_;
          auVar41 = vmulps_avx512vl(auVar71,auVar54);
          auVar44 = vbroadcastss_avx512vl(auVar44);
          auVar54 = vfmadd213ps_avx512vl(auVar50,auVar44,auVar41);
          auVar41 = vmulps_avx512vl(auVar71,auVar55);
          auVar55 = vfmadd213ps_avx512vl(auVar49,auVar44,auVar41);
          auVar41 = vsubss_avx512f(auVar48,auVar45);
          auVar41 = vmaxss_avx(auVar41,ZEXT816(0) << 0x40);
          auVar44 = vsubss_avx512f(auVar47,auVar41);
          auVar48._0_4_ = auVar41._0_4_;
          auVar48._4_4_ = auVar48._0_4_;
          auVar48._8_4_ = auVar48._0_4_;
          auVar48._12_4_ = auVar48._0_4_;
          auVar45._0_4_ = auVar48._0_4_ * auVar56._0_4_;
          auVar45._4_4_ = auVar48._0_4_ * auVar56._4_4_;
          auVar45._8_4_ = auVar48._0_4_ * auVar56._8_4_;
          auVar45._12_4_ = auVar48._0_4_ * auVar56._12_4_;
          auVar41 = vbroadcastss_avx512vl(auVar44);
          auVar45 = vfmadd213ps_avx512vl(auVar52,auVar41,auVar45);
          auVar44 = vmulps_avx512vl(auVar48,auVar51);
          auVar40 = vfmadd213ps_avx512vl(auVar40,auVar41,auVar44);
          uVar22 = iVar35 + 1;
          if ((int)uVar22 < (int)uVar27) {
            auVar41 = vsubss_avx512f(auVar42,auVar43);
            psVar34 = &pBVar12[uVar22].super_RawBufferView.stride;
            auVar72 = ZEXT1664(auVar53);
            auVar73 = ZEXT864(0) << 0x20;
            do {
              auVar49._0_4_ = (float)(int)uVar22;
              auVar49._4_12_ = auVar76._4_12_;
              auVar42 = vdivss_avx512f(auVar49,ZEXT416((uint)fVar4));
              auVar42 = vsubss_avx512f(auVar42,auVar43);
              auVar42 = vdivss_avx512f(auVar42,auVar41);
              auVar50._0_4_ = auVar42._0_4_;
              fVar3 = auVar74._0_4_ - auVar50._0_4_;
              auVar50._4_4_ = auVar50._0_4_;
              auVar50._8_4_ = auVar50._0_4_;
              auVar50._12_4_ = auVar50._0_4_;
              auVar42 = vmulps_avx512vl(auVar45,auVar50);
              auVar52._4_4_ = fVar3;
              auVar52._0_4_ = fVar3;
              auVar52._8_4_ = fVar3;
              auVar52._12_4_ = fVar3;
              auVar44 = vfmadd231ps_avx512vl(auVar42,auVar52,auVar54);
              auVar42 = vmulps_avx512vl(auVar40,auVar50);
              auVar48 = vfmadd231ps_avx512vl(auVar42,auVar55,auVar52);
              auVar42 = *(undefined1 (*) [16])
                         (((RawBufferView *)(psVar34 + -2))->ptr_ofs + *psVar34 * uVar32);
              uVar7 = *(undefined4 *)
                       (((RawBufferView *)(psVar34 + -2))->ptr_ofs + *psVar34 * uVar32 + 0xc);
              auVar53._4_4_ = uVar7;
              auVar53._0_4_ = uVar7;
              auVar53._8_4_ = uVar7;
              auVar53._12_4_ = uVar7;
              auVar53 = vmulps_avx512vl(auVar46,auVar53);
              auVar49 = vsubps_avx512vl(auVar42,auVar53);
              auVar44 = vsubps_avx512vl(auVar49,auVar44);
              auVar42 = vaddps_avx512vl(auVar42,auVar53);
              auVar42 = vsubps_avx(auVar42,auVar48);
              auVar53 = vminps_avx512vl(auVar44,ZEXT816(0) << 0x40);
              auVar42 = vmaxps_avx(auVar42,ZEXT816(0) << 0x40);
              auVar54 = vaddps_avx512vl(auVar54,auVar53);
              auVar45 = vaddps_avx512vl(auVar45,auVar53);
              auVar55 = vaddps_avx512vl(auVar55,auVar42);
              auVar40 = vaddps_avx512vl(auVar40,auVar42);
              uVar22 = uVar22 + 1;
              psVar34 = psVar34 + 7;
              auVar75 = ZEXT1664(auVar47);
            } while (uVar27 != uVar22);
          }
          else {
            auVar72 = ZEXT1664(auVar53);
            auVar73 = ZEXT864(0) << 0x20;
            auVar75 = ZEXT1664(auVar47);
          }
        }
        aVar10 = (anon_union_16_2_47237d3f_for_Vec3fx_0)
                 vinsertps_avx512f(auVar54,ZEXT416(geomID),0x30);
        uVar22 = (this->super_Points).super_Geometry.numTimeSteps - 1;
        uVar33 = (ulong)uVar22;
        BVar9 = (this->super_Points).super_Geometry.time_range;
        auVar47._8_8_ = 0;
        auVar47._0_4_ = BVar9.lower;
        auVar47._4_4_ = BVar9.upper;
        aVar18 = (anon_union_16_2_47237d3f_for_Vec3fx_0)
                 vinsertps_avx512f(auVar55,ZEXT416((uint)uVar32),0x30);
        aVar19 = (anon_union_16_2_47237d3f_for_Vec3fx_0)
                 vinsertps_avx512f(auVar45,ZEXT416(uVar22),0x30);
        aVar20 = (anon_union_16_2_47237d3f_for_Vec3fx_0)
                 vinsertps_avx512f(auVar40,ZEXT416(uVar22),0x30);
        auVar40 = vmulps_avx512vl((undefined1  [16])aVar19,auVar76);
        auVar40 = vfmadd231ps_avx512vl(auVar40,(undefined1  [16])aVar10,auVar76);
        auVar41 = vmulps_avx512vl((undefined1  [16])aVar20,auVar76);
        auVar41 = vfmadd231ps_avx512vl(auVar41,(undefined1  [16])aVar18,auVar76);
        auVar41 = vaddps_avx512vl(auVar40,auVar41);
        auVar40 = vminps_avx(auVar58._0_16_,(undefined1  [16])aVar10);
        auVar58 = ZEXT1664(auVar40);
        auVar40 = vmaxps_avx512vl(auVar64._0_16_,(undefined1  [16])aVar18);
        auVar64 = ZEXT1664(auVar40);
        auVar40 = vminps_avx512vl(auVar70._0_16_,(undefined1  [16])aVar19);
        auVar70 = ZEXT1664(auVar40);
        auVar40 = vmaxps_avx512vl(auVar68._0_16_,(undefined1  [16])aVar20);
        auVar68 = ZEXT1664(auVar40);
        auVar40 = vminps_avx512vl(auVar66._0_16_,auVar41);
        auVar66 = ZEXT1664(auVar40);
        auVar40 = vmaxps_avx512vl(auVar78._0_16_,auVar41);
        auVar78 = ZEXT1664(auVar40);
        uVar36 = vcmpps_avx512vl(auVar61,auVar47,1);
        auVar41 = vinsertps_avx512f(auVar61,auVar47,0x50);
        auVar40 = vblendps_avx(auVar47,auVar61,2);
        bVar38 = (bool)((byte)uVar36 & 1);
        bVar14 = (bool)((byte)(uVar36 >> 1) & 1);
        bVar15 = (bool)((byte)(uVar36 >> 2) & 1);
        bVar16 = (bool)((byte)(uVar36 >> 3) & 1);
        auVar62 = ZEXT1664(CONCAT412((uint)bVar16 * auVar41._12_4_ | (uint)!bVar16 * auVar40._12_4_,
                                     CONCAT48((uint)bVar15 * auVar41._8_4_ |
                                              (uint)!bVar15 * auVar40._8_4_,
                                              CONCAT44((uint)bVar14 * auVar41._4_4_ |
                                                       (uint)!bVar14 * auVar40._4_4_,
                                                       (uint)bVar38 * auVar41._0_4_ |
                                                       (uint)!bVar38 * auVar40._0_4_))));
        local_48 = local_48 + 1;
        sVar29 = sVar29 + uVar33;
        bVar38 = uVar26 < uVar33;
        auVar40 = vmovshdup_avx512vl(auVar47);
        auVar59 = ZEXT1664(CONCAT124(auVar59._4_12_,
                                     (uint)bVar38 * auVar40._0_4_ + (uint)!bVar38 * auVar59._0_4_));
        auVar60 = ZEXT1664(CONCAT124(auVar60._4_12_,
                                     (uint)bVar38 * (int)BVar9.lower + (uint)!bVar38 * auVar60._0_4_
                                    ));
        if (uVar26 <= uVar33) {
          uVar26 = uVar33;
        }
        pPVar24 = prims->items;
        sVar30 = k + 1;
        pPVar24[k].lbounds.bounds0.lower.field_0 = aVar10;
        pPVar24[k].lbounds.bounds0.upper.field_0 = aVar18;
        pPVar24[k].lbounds.bounds1.lower.field_0 = aVar19;
        pPVar24[k].lbounds.bounds1.upper.field_0 = aVar20;
        pPVar24[k].time_range = BVar9;
      }
LAB_01fb5be9:
      auVar40 = auVar62._0_16_;
      aVar63 = auVar64._0_16_;
      aVar57 = auVar58._0_16_;
      uVar32 = uVar32 + 1;
      k = sVar30;
      auVar74 = auVar75;
    } while (uVar32 < r->_end);
    (__return_storage_ptr__->object_range)._end = local_48;
    aVar69 = auVar70._0_16_;
    aVar67 = auVar68._0_16_;
    aVar65 = auVar66._0_16_;
    aVar77 = auVar78._0_16_;
  }
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds0.lower.
  field_0 = aVar57;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds0.upper.
  field_0 = aVar63;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds1.lower.
  field_0 = aVar69;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds1.upper.
  field_0 = aVar67;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).centBounds.lower.field_0
       = aVar65;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).centBounds.upper.field_0
       = aVar77;
  BVar9 = (BBox1f)vmovlps_avx(auVar40);
  __return_storage_ptr__->time_range = BVar9;
  __return_storage_ptr__->num_time_segments = sVar29;
  __return_storage_ptr__->max_num_time_segments = uVar26;
  (__return_storage_ptr__->max_time_range).lower = auVar60._0_4_;
  (__return_storage_ptr__->max_time_range).upper = auVar59._0_4_;
  return __return_storage_ptr__;
}

Assistant:

PrimInfoMB createPrimRefMBArray(mvector<PrimRefMB>& prims,
                                      const BBox1f& t0t1,
                                      const range<size_t>& r,
                                      size_t k,
                                      unsigned int geomID) const
      {
        PrimInfoMB pinfo(empty);
        for (size_t j = r.begin(); j < r.end(); j++) {
          if (!valid(j, timeSegmentRange(t0t1)))
            continue;
          const PrimRefMB prim(linearBounds(j, t0t1), this->numTimeSegments(), this->time_range, this->numTimeSegments(), geomID, unsigned(j));
          pinfo.add_primref(prim);
          prims[k++] = prim;
        }
        return pinfo;
      }